

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLoadAndStoreCase::ImageLoadAndStoreCase
          (ImageLoadAndStoreCase *this,Context *context,char *name,char *description,
          TextureFormat *textureFormat,TextureFormat *imageFormat,TextureType textureType,
          deUint32 caseFlags)

{
  TextureFormat *imageFormat_local;
  TextureFormat *textureFormat_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ImageLoadAndStoreCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageLoadAndStoreCase_011c1f00;
  this->m_textureFormat = *textureFormat;
  this->m_imageFormat = *imageFormat;
  this->m_textureType = textureType;
  this->m_restrictImages = (caseFlags & 2) != 0;
  this->m_singleLayerBind = (caseFlags & 1) != 0;
  return;
}

Assistant:

ImageLoadAndStoreCase (Context& context, const char* name, const char* description, const TextureFormat& textureFormat, const TextureFormat& imageFormat, TextureType textureType, deUint32 caseFlags = 0)
		: TestCase				(context, name, description)
		, m_textureFormat		(textureFormat)
		, m_imageFormat			(imageFormat)
		, m_textureType			(textureType)
		, m_restrictImages		((caseFlags & CASEFLAG_RESTRICT_IMAGES)		!= 0)
		, m_singleLayerBind		((caseFlags & CASEFLAG_SINGLE_LAYER_BIND)	!= 0)
	{
		DE_ASSERT(textureFormat.getPixelSize() == imageFormat.getPixelSize());
	}